

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O2

void __thiscall
DIS::MinefieldResponseNackPdu::marshal(MinefieldResponseNackPdu *this,DataStream *dataStream)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  EightByteChunk x;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_missingPduSequenceNumbers).
                                     super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_missingPduSequenceNumbers).
                                    super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4));
  lVar2 = 8;
  for (uVar3 = 0;
      pEVar1 = (this->_missingPduSequenceNumbers).
               super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_missingPduSequenceNumbers).
                            super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 4);
      uVar3 = uVar3 + 1) {
    x._vptr_EightByteChunk = (_func_int **)&PTR__EightByteChunk_001b0b48;
    x._otherParameters = *(char (*) [8])(pEVar1->_otherParameters + lVar2 + -8);
    EightByteChunk::marshal(&x,dataStream);
    EightByteChunk::~EightByteChunk(&x);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void MinefieldResponseNackPdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    _requestingEntityID.marshal(dataStream);
    dataStream << _requestID;
    dataStream << ( unsigned char )_missingPduSequenceNumbers.size();

     for(size_t idx = 0; idx < _missingPduSequenceNumbers.size(); idx++)
     {
        EightByteChunk x = _missingPduSequenceNumbers[idx];
        x.marshal(dataStream);
     }

}